

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool spirv_cross::CompilerGLSL::needs_enclose_expression(string *expr)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  int iVar4;
  
  pbVar2 = (byte *)(expr->_M_dataplus)._M_p;
  if (expr->_M_string_length != 0) {
    bVar1 = *pbVar2;
    if (((ulong)bVar1 < 0x2e) && ((0x2c4200000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      return true;
    }
    if (bVar1 == 0x7e) {
      return true;
    }
  }
  sVar3 = 0;
  iVar4 = 0;
  do {
    if (expr->_M_string_length == sVar3) {
      if (iVar4 == 0) {
        return false;
      }
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x140a,
                    "static bool spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                   );
    }
    bVar1 = pbVar2[sVar3];
    if (bVar1 == 0x28) {
LAB_0012db04:
      iVar4 = iVar4 + 1;
    }
    else if ((bVar1 == 0x29) || (bVar1 == 0x5d)) {
      if (iVar4 == 0) {
        __assert_fail("paren_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x1401,
                      "static bool spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                     );
      }
      iVar4 = iVar4 + -1;
    }
    else {
      if (bVar1 == 0x5b) goto LAB_0012db04;
      if (bVar1 == 0x20 && iVar4 == 0) {
        return true;
      }
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

bool CompilerGLSL::needs_enclose_expression(const std::string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	return need_parens;
}